

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

int ImGui::ScaleValueFromRatioT<int,int,float>
              (ImGuiDataType data_type,float t,int v_min,int v_max,bool is_logarithmic,
              float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  bool bVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  float fVar18;
  undefined1 in_register_00001204 [60];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar22 [64];
  undefined1 auVar24 [12];
  undefined1 auVar23 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar25 [16];
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 in_ZMM9 [64];
  undefined1 in_register_00001484 [12];
  undefined1 local_18 [16];
  undefined1 extraout_var [60];
  
  auVar22._4_60_ = in_register_00001244;
  auVar22._0_4_ = logarithmic_zero_epsilon;
  auVar20._4_60_ = in_register_00001204;
  auVar20._0_4_ = t;
  if (v_max - v_min == 0) {
    return v_min;
  }
  local_18 = auVar22._0_16_;
  auVar24 = in_ZMM3._4_12_;
  if (!is_logarithmic) {
    if ((data_type & 0xfffffffeU) == 8) {
      auVar17._0_4_ = (float)v_min;
      auVar17._4_12_ = auVar24;
      auVar14._0_4_ = (float)(v_max - v_min);
      auVar14._4_12_ = auVar24;
      auVar17 = vfmadd213ss_fma(auVar20._0_16_,auVar14,auVar17);
      return (int)auVar17._0_4_;
    }
    if (1.0 <= t) {
      return v_max;
    }
    return v_min + (int)((float)(v_max - v_min) * t +
                        *(float *)(&DAT_00552c88 + (ulong)(v_max < v_min) * 4));
  }
  if (t <= 0.0) {
    return v_min;
  }
  if (1.0 <= t) {
    return v_max;
  }
  bVar1 = v_max < v_min;
  auVar19._0_4_ = (float)v_min;
  auVar19._4_12_ = auVar24;
  auVar23._8_4_ = 0x7fffffff;
  auVar23._0_8_ = 0x7fffffff7fffffff;
  auVar23._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx(auVar19,auVar23);
  bVar10 = v_min < 0;
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar14 = vxorps_avx512vl(local_18,auVar5);
  iVar26 = auVar14._0_4_;
  uVar3 = vcmpss_avx512f(auVar17,local_18,1);
  bVar4 = (bool)((byte)uVar3 & 1);
  iVar11 = (uint)bVar4 * ((uint)bVar10 * iVar26 + (uint)!bVar10 * (int)logarithmic_zero_epsilon) +
           (uint)!bVar4 * (int)auVar19._0_4_;
  auVar25._0_4_ = (float)v_max;
  auVar25._4_12_ = in_ZMM9._4_12_;
  auVar17 = vandps_avx(auVar25,auVar23);
  uVar3 = vcmpss_avx512f(auVar17,local_18,1);
  bVar4 = (bool)((byte)uVar3 & 1);
  iVar12 = (uint)bVar4 *
           ((uint)(v_max < 0) * iVar26 + (uint)(v_max >= 0) * (int)logarithmic_zero_epsilon) +
           (uint)!bVar4 * (int)auVar25._0_4_;
  auVar15._0_4_ = (float)((uint)bVar1 * iVar12 + (uint)!bVar1 * iVar11);
  auVar15._4_12_ = auVar24;
  iVar11 = (uint)bVar1 * iVar11 + (uint)!bVar1 * iVar12;
  auVar16._0_4_ =
       (float)((uint)bVar10 * ((uint)(v_max == 0) * iVar26 + (uint)(v_max != 0) * iVar11) +
              (uint)!bVar10 * iVar11);
  auVar16._4_12_ = in_ZMM9._4_12_;
  fVar13 = (float)((uint)bVar1 * (int)(1.0 - t) + (uint)!bVar1 * (int)t);
  if (v_max * v_min < 0) {
    if (v_min < v_max) {
      v_max = v_min;
    }
    auVar27._0_4_ = (float)v_max;
    auVar27._4_12_ = in_register_00001484;
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar17 = vxorps_avx512vl(auVar27,auVar6);
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(ZEXT416((uint)(auVar25._0_4_ - auVar19._0_4_)),auVar7);
    fVar18 = auVar17._0_4_ / auVar14._0_4_;
    fVar2 = fVar18 + zero_deadzone_halfsize;
    if ((fVar18 - zero_deadzone_halfsize <= fVar13) && (fVar13 <= fVar2)) {
      return 0;
    }
    if (fVar13 < fVar18) {
      auVar8._8_4_ = 0x80000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar8._12_4_ = 0x80000000;
      auVar17 = vxorps_avx512vl(auVar15,auVar8);
      auVar21._0_4_ =
           powf(auVar17._0_4_ / logarithmic_zero_epsilon,
                1.0 - fVar13 / (fVar18 - zero_deadzone_halfsize));
      auVar21._4_60_ = extraout_var;
      auVar9._8_4_ = 0x80000000;
      auVar9._0_8_ = 0x8000000080000000;
      auVar9._12_4_ = 0x80000000;
      auVar17 = vxorps_avx512vl(auVar21._0_16_,auVar9);
      fVar13 = auVar17._0_4_;
      goto LAB_00305084;
    }
    fVar18 = auVar16._0_4_ / logarithmic_zero_epsilon;
    fVar13 = (fVar13 - fVar2) / (1.0 - fVar2);
  }
  else if ((v_max | v_min) < 0) {
    fVar18 = auVar15._0_4_ / auVar16._0_4_;
    fVar13 = 1.0 - fVar13;
    local_18 = auVar16;
  }
  else {
    fVar18 = auVar16._0_4_ / auVar15._0_4_;
    local_18 = auVar15;
  }
  fVar13 = powf(fVar18,fVar13);
LAB_00305084:
  return (int)(fVar13 * (float)local_18._0_4_);
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}